

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall
QtPrivate::QWellArray::paintCellContents(QWellArray *this,QPainter *p,int row,int col,QRect *r)

{
  long in_FS_OFFSET;
  QPoint local_40;
  QColor local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::fillRect(p,r,white);
  QColor::QColor(&local_38,black);
  QPainter::setPen((QColor *)p);
  local_38._0_8_ = *(undefined8 *)r;
  local_40.xp.m_i = (r->x2).m_i;
  local_40.yp.m_i = (r->y2).m_i;
  QPainter::drawLine(p,(QPoint *)&local_38,&local_40);
  local_38.ct._0_4_ = (r->y1).m_i;
  local_38.cspec = (r->x2).m_i;
  local_40.yp.m_i = (r->y2).m_i;
  local_40.xp.m_i = (r->x1).m_i;
  QPainter::drawLine(p,(QPoint *)&local_38,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWellArray::paintCellContents(QPainter *p, int row, int col, const QRect &r)
{
    Q_UNUSED(row);
    Q_UNUSED(col);
    p->fillRect(r, Qt::white);
    p->setPen(Qt::black);
    p->drawLine(r.topLeft(), r.bottomRight());
    p->drawLine(r.topRight(), r.bottomLeft());
}